

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O0

void __thiscall IRC_Bot::~IRC_Bot(IRC_Bot *this)

{
  IRC_Bot *this_local;
  
  ~IRC_Bot(this);
  operator_delete(this,0x378);
  return;
}

Assistant:

IRC_Bot::~IRC_Bot() {
	if (IRCCommand::selected_server == this) {
		IRCCommand::selected_server = nullptr;
	}

	if (IRCCommand::active_server == this) {
		IRCCommand::active_server = IRCCommand::selected_server;
	}
}